

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

int Abc_SuppSolve(Vec_Wrd_t *p,int nVars)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Wrd_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *p_02;
  int *pCounts;
  ulong uVar7;
  long lVar8;
  timespec ts;
  long local_68;
  timespec local_50;
  word *local_40;
  Vec_Wrd_t *local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_68 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = p->nSize;
  lVar8 = (long)iVar3;
  p_00->nSize = iVar3;
  p_00->nCap = iVar3;
  if (lVar8 == 0) {
    local_40 = (word *)0x0;
  }
  else {
    local_40 = (word *)malloc(lVar8 * 8);
  }
  p_00->pArray = local_40;
  memcpy(local_40,p->pArray,lVar8 * 8);
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 0x40;
  p_01->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(0x40,0x10);
  p_01->pArray = pVVar6;
  p_01->nSize = 0x40;
  p_02 = (Vec_Wec_t *)malloc(0x10);
  p_02->nCap = 0x40;
  p_02->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(0x40,0x10);
  p_02->pArray = pVVar6;
  p_02->nSize = 0x40;
  pCounts = (int *)malloc(lVar8 << 2);
  if (0 < p->nSize) {
    lVar8 = 0;
    local_38 = p;
    do {
      uVar1 = local_38->pArray[lVar8];
      uVar7 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
      uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
      uVar7 = ((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      uVar4 = (uint)(byte)(uVar7 >> 0x38);
      pCounts[lVar8] = uVar4;
      if (uVar7 >> 0x38 == 1) {
        if (0 < nVars) {
          uVar7 = 0;
          do {
            if ((uVar1 >> (uVar7 & 0x3f) & 1) != 0) {
              Vec_WecPush(p_01,(int)uVar7,(int)lVar8);
            }
            uVar7 = uVar7 + 1;
          } while ((uint)nVars != uVar7);
        }
      }
      else if ((uVar4 == 2) && (0 < nVars)) {
        uVar7 = 0;
        do {
          if ((uVar1 >> (uVar7 & 0x3f) & 1) != 0) {
            Vec_WecPush(p_02,(int)uVar7,(int)lVar8);
          }
          uVar7 = uVar7 + 1;
        } while ((uint)nVars != uVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_38->nSize);
  }
  iVar5 = 3;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar8 + local_68) / 1000000.0);
  iVar5 = Abc_SuppFindVar(p_01,p_02,nVars);
  iVar3 = nVars;
  while (iVar5 != -1) {
    Abc_SuppRemove(p_00,pCounts,p_01,p_02,iVar5,nVars);
    iVar3 = iVar3 + -1;
    iVar5 = Abc_SuppFindVar(p_01,p_02,nVars);
  }
  iVar5 = p_01->nCap;
  if (0 < (long)iVar5) {
    pVVar6 = p_01->pArray;
    lVar8 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar6->pArray + lVar8);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar6->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar5 * 0x10 != lVar8);
  }
  if (p_01->pArray != (Vec_Int_t *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (Vec_Int_t *)0x0;
  }
  p_01->nCap = 0;
  p_01->nSize = 0;
  free(p_01);
  iVar5 = p_02->nCap;
  if (0 < (long)iVar5) {
    pVVar6 = p_02->pArray;
    lVar8 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar6->pArray + lVar8);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar6->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar5 * 0x10 != lVar8);
  }
  if (p_02->pArray != (Vec_Int_t *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (Vec_Int_t *)0x0;
  }
  p_02->nCap = 0;
  p_02->nSize = 0;
  free(p_02);
  if (local_40 != (word *)0x0) {
    free(local_40);
    p_00->pArray = (word *)0x0;
  }
  free(p_00);
  if (pCounts != (int *)0x0) {
    free(pCounts);
  }
  return iVar3;
}

Assistant:

int Abc_SuppSolve( Vec_Wrd_t * p, int nVars )
{
    abctime clk = Abc_Clock();
    Vec_Wrd_t * pNew = Vec_WrdDup( p );
    Vec_Wec_t * vSingles = Vec_WecStart( 64 );
    Vec_Wec_t * vDoubles = Vec_WecStart( 64 );
    word Entry; int i, v, iVar, nVarsNew = nVars;
    int * pCounts = ABC_ALLOC( int, Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        pCounts[i] = Abc_SuppCountOnes64( Entry );
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vSingles, v, i );
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vDoubles, v, i );
        }
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_SuppProfile( vSingles, vDoubles, nVars );
    // find variable in 0 singles and the smallest doubles
    while ( 1 )
    {
        iVar = Abc_SuppFindVar( vSingles, vDoubles, nVars );
        if ( iVar == -1 )
            break;
//        printf( "Selected variable %d.\n", iVar );
        Abc_SuppRemove( pNew, pCounts, vSingles, vDoubles, iVar, nVars );
//        Abc_SuppProfile( vSingles, vDoubles, nVars );
        nVarsNew--;
    }
//    printf( "Result = %d (out of %d)\n", nVarsNew, nVars );
    Vec_WecFree( vSingles );
    Vec_WecFree( vDoubles );
    Vec_WrdFree( pNew );
    ABC_FREE( pCounts );
    return nVarsNew;
}